

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_reader.c
# Opt level: O2

int dlep_reader_peer_type
              (char *text,size_t text_length,_Bool *secured_medium,dlep_session *session,
              dlep_parser_value *value)

{
  ushort uVar1;
  int iVar2;
  uint8_t *puVar3;
  ulong uVar4;
  
  iVar2 = -1;
  if ((value == (dlep_parser_value *)0x0) &&
     (value = dlep_session_get_tlv_value(session,4), value == (dlep_parser_value *)0x0)) {
    return -1;
  }
  if (value->length != 0) {
    puVar3 = (session->parser).tlv_ptr;
    uVar1 = value->index;
    *secured_medium = (_Bool)(puVar3[uVar1] & 1);
    iVar2 = 0;
    if (text_length != 0 && 1 < value->length) {
      uVar4 = (ulong)(value->length - 1);
      puVar3 = puVar3 + (ulong)uVar1 + 1;
      if (uVar4 < text_length - 1) {
        memcpy(text,puVar3,uVar4);
        uVar4 = (ulong)(value->length - 1);
      }
      else {
        uVar4 = text_length - 2;
        memcpy(text,puVar3,uVar4);
      }
      text[uVar4] = '\0';
    }
  }
  return iVar2;
}

Assistant:

int
dlep_reader_peer_type(
  char *text, size_t text_length, bool *secured_medium, struct dlep_session *session, struct dlep_parser_value *value) {
  const uint8_t *ptr;

  if (!value) {
    value = dlep_session_get_tlv_value(session, DLEP_PEER_TYPE_TLV);
    if (!value) {
      return -1;
    }
  }
  if (value->length == 0) {
    return -1;
  }

  ptr = dlep_session_get_tlv_binary(session, value);

  *secured_medium = (ptr[0] & DLEP_PEER_TYPE_SECURED) != 0;

  if (value->length > 1 && text_length > 0) {
    /* generate a 0 terminated copy of the text */
    if (text_length - 1u > value->length - 1u) {
      memcpy(text, &ptr[1], value->length - 1u);
      text[value->length - 1u] = 0;
    }
    else {
      memcpy(text, &ptr[1], text_length - 2u);
      text[text_length - 2u] = 0;
    }
  }
  return 0;
}